

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O0

int select_ncolors(j_decompress_ptr cinfo,int *Ncolors)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  int local_44;
  long local_40;
  long temp;
  boolean changed;
  int j;
  int i;
  int iroot;
  int total_colors;
  int max_colors;
  int nc;
  int *Ncolors_local;
  j_decompress_ptr cinfo_local;
  
  iVar1 = cinfo->out_color_components;
  iVar2 = cinfo->desired_number_of_colors;
  j = 1;
  iVar4 = j;
  do {
    j = iVar4;
    iVar4 = j + 1;
    local_40 = (long)iVar4;
    for (changed = 1; changed < iVar1; changed = changed + 1) {
      local_40 = iVar4 * local_40;
    }
  } while (local_40 <= iVar2);
  if (j < 2) {
    cinfo->err->msg_code = 0x3a;
    (cinfo->err->msg_parm).i[0] = (int)local_40;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  i = 1;
  for (changed = 0; changed < iVar1; changed = changed + 1) {
    Ncolors[changed] = j;
    i = j * i;
  }
  do {
    bVar3 = false;
    for (changed = 0; changed < iVar1; changed = changed + 1) {
      if (cinfo->out_color_space == JCS_RGB) {
        local_44 = select_ncolors::RGB_order[changed];
      }
      else {
        local_44 = changed;
      }
      lVar5 = (long)(Ncolors[local_44] + 1) * (long)(i / Ncolors[local_44]);
      if (iVar2 < lVar5) break;
      Ncolors[local_44] = Ncolors[local_44] + 1;
      i = (int)lVar5;
      bVar3 = true;
    }
    if (!bVar3) {
      return i;
    }
  } while( true );
}

Assistant:

LOCAL(int)
select_ncolors (j_decompress_ptr cinfo, int Ncolors[])
/* Determine allocation of desired colors to components, */
/* and fill in Ncolors[] array to indicate choice. */
/* Return value is total number of colors (product of Ncolors[] values). */
{
  int nc = cinfo->out_color_components; /* number of color components */
  int max_colors = cinfo->desired_number_of_colors;
  int total_colors, iroot, i, j;
  boolean changed;
  long temp;
  static const int RGB_order[3] = { RGB_GREEN, RGB_RED, RGB_BLUE };

  /* We can allocate at least the nc'th root of max_colors per component. */
  /* Compute floor(nc'th root of max_colors). */
  iroot = 1;
  do {
    iroot++;
    temp = iroot;		/* set temp = iroot ** nc */
    for (i = 1; i < nc; i++)
      temp *= iroot;
  } while (temp <= (long) max_colors); /* repeat till iroot exceeds root */
  iroot--;			/* now iroot = floor(root) */

  /* Must have at least 2 color values per component */
  if (iroot < 2)
    ERREXIT1(cinfo, JERR_QUANT_FEW_COLORS, (int) temp);

  /* Initialize to iroot color values for each component */
  total_colors = 1;
  for (i = 0; i < nc; i++) {
    Ncolors[i] = iroot;
    total_colors *= iroot;
  }
  /* We may be able to increment the count for one or more components without
   * exceeding max_colors, though we know not all can be incremented.
   * Sometimes, the first component can be incremented more than once!
   * (Example: for 16 colors, we start at 2*2*2, go to 3*2*2, then 4*2*2.)
   * In RGB colorspace, try to increment G first, then R, then B.
   */
  do {
    changed = FALSE;
    for (i = 0; i < nc; i++) {
      j = (cinfo->out_color_space == JCS_RGB ? RGB_order[i] : i);
      /* calculate new total_colors if Ncolors[j] is incremented */
      temp = total_colors / Ncolors[j];
      temp *= Ncolors[j]+1;	/* done in long arith to avoid oflo */
      if (temp > (long) max_colors)
	break;			/* won't fit, done with this pass */
      Ncolors[j]++;		/* OK, apply the increment */
      total_colors = (int) temp;
      changed = TRUE;
    }
  } while (changed);

  return total_colors;
}